

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int diff_hdrs(nifti_1_header *s0,nifti_1_header *s1,int display)

{
  field_s *fieldp;
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  iVar2 = 0;
  do {
    fieldp = (field_s *)(g_hdr_fields[0].name + lVar3 + -0x10);
    iVar1 = diff_field(fieldp,s0,s1,1);
    if (iVar1 != 0) {
      if (display != 0) {
        disp_field((char *)0x0,fieldp,s0,1,(uint)(iVar2 == 0));
        disp_field((char *)0x0,fieldp,s1,1,0);
      }
      iVar2 = iVar2 + 1;
    }
    lVar3 = lVar3 + 0x24;
  } while ((int)lVar3 != 0x60c);
  return iVar2;
}

Assistant:

int diff_hdrs( nifti_1_header * s0, nifti_1_header * s1, int display )
{
   field_s * fp = g_hdr_fields;
   int       c, ndiff = 0;

   for( c = 0; c < NT_HDR_NUM_FIELDS; c++, fp++ )
      if( diff_field(fp, s0, s1, 1) )
      {
         if( display ) disp_field(NULL, fp, s0, 1, ndiff == 0);
         if( display ) disp_field(NULL, fp, s1, 1, 0);
         ndiff++;
      }

   return ndiff;
}